

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cw_bwt.h
# Opt level: O2

void __thiscall
bwtil::cw_bwt::cw_bwt(cw_bwt *this,string *input_string,cw_bwt_input_type input_type,bool verbose)

{
  int iVar1;
  BackwardFileIterator *this_00;
  undefined4 extraout_var;
  ContextAutomata *ctx;
  undefined1 auVar2 [32];
  undefined1 auVar3 [64];
  ContextAutomata local_d0;
  
  auVar2 = ZEXT1632(ZEXT816(0) << 0x40);
  *(undefined1 (*) [32])
   &(this->ca).inverse_remapping.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = auVar2;
  (this->ca).inverse_remapping =
       (vector<unsigned_char,_std::allocator<unsigned_char>_>)auVar2._0_24_;
  (this->ca).remapping.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)auVar2._24_8_;
  auVar2 = ZEXT1632(ZEXT816(0) << 0x40);
  (this->ca).prefix_nr = (vector<unsigned_int,_std::allocator<unsigned_int>_>)auVar2._0_24_;
  (this->ca).edges.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)auVar2._24_8_;
  *(undefined1 (*) [32])
   &(this->ca).prefix_nr.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = auVar2;
  auVar3 = ZEXT464(0) << 0x40;
  this->partial_sums =
       (vector<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_>)auVar3._0_24_;
  this->dynStrings =
       (vector<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
        )auVar3._24_24_;
  (this->frequencies).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)auVar3._48_8_;
  (this->frequencies).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)auVar3._56_8_;
  *(undefined1 (*) [64])
   &(this->dynStrings).
    super__Vector_base<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = auVar3;
  this->verbose = verbose;
  if (input_type == path) {
    this_00 = (BackwardFileIterator *)operator_new(0x60);
    BackwardFileIterator::BackwardFileIterator(this_00,input_string);
  }
  else {
    this_00 = (BackwardFileIterator *)operator_new(0x30);
    BackwardStringIterator::BackwardStringIterator((BackwardStringIterator *)this_00,input_string);
  }
  this->bwIt = &this_00->super_BackwardIterator;
  iVar1 = (*(this_00->super_BackwardIterator)._vptr_BackwardIterator[6])(this_00);
  this->n = CONCAT44(extraout_var,iVar1);
  ContextAutomata::ContextAutomata(&local_d0,this->bwIt,10,verbose);
  ctx = &local_d0;
  ContextAutomata::operator=(&this->ca,&local_d0);
  ContextAutomata::~ContextAutomata(&local_d0);
  this->k = (this->ca).k;
  init(this,(EVP_PKEY_CTX *)ctx);
  if (this->bwIt != (BackwardIterator *)0x0) {
    (*this->bwIt->_vptr_BackwardIterator[1])();
  }
  return;
}

Assistant:

cw_bwt(string &input_string, cw_bwt_input_type input_type, bool verbose=false){

		this->verbose=verbose;

		if(input_type==path)
			bwIt = new BackwardFileIterator(input_string);
		else
			bwIt = new BackwardStringIterator(input_string);

		n = bwIt->length();

		ca = ContextAutomata(bwIt, 10, verbose);//Default automata overhead
		k = ca.contextLength();

		init();

		delete bwIt;

	}